

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cookmem_02.cpp
# Opt level: O0

int test3(void)

{
  bool bVar1;
  ostream *poVar2;
  void *pvVar3;
  size_type sVar4;
  ulong local_2a8;
  size_t size;
  void *ptr;
  undefined1 local_288 [8];
  SimpleMemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> memCtx;
  
  cookmem::SimpleMemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
  SimpleMemContext((SimpleMemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *)
                   local_288,true);
  bVar1 = cookmem::MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::isPadding
                    ((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *)
                     &memCtx.
                      super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>.
                      field_0x10);
  if (bVar1) {
    bVar1 = cookmem::MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
            isStoringExactSize((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *
                               )&memCtx.
                                 super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                                 .field_0x10);
    if (bVar1) {
      pvVar3 = cookmem::MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                         ((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *)
                          &memCtx.
                           super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                           .field_0x10,0x1e);
      if (pvVar3 == (void *)0x0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x73);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        memCtx.super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.m_pool.
        _580_4_ = 1;
      }
      else {
        memset(pvVar3,0xff,0x1e);
        sVar4 = cookmem::MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getSize
                          ((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *)
                           &memCtx.
                            super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                            .field_0x10,pvVar3);
        if (sVar4 == 0x1e) {
          cookmem::MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::deallocate
                    ((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *)
                     &memCtx.
                      super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>.
                      field_0x10,pvVar3,0);
          pvVar3 = cookmem::MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                   allocate((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *)
                            &memCtx.
                             super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                             .field_0x10,300);
          if (pvVar3 == (void *)0x0) {
            poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x79);
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            memCtx.super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.m_pool.
            _580_4_ = 1;
          }
          else {
            memset(pvVar3,0xff,300);
            sVar4 = cookmem::MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                    getSize((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *)
                            &memCtx.
                             super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                             .field_0x10,pvVar3);
            if (sVar4 == 300) {
              pvVar3 = cookmem::MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                       allocate((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                 *)&memCtx.
                                    super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                                    .field_0x10,3000);
              if (pvVar3 == (void *)0x0) {
                poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x7e);
                std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                memCtx.super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.
                m_pool._580_4_ = 1;
              }
              else {
                memset(pvVar3,0xff,3000);
                sVar4 = cookmem::MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                        ::getSize((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                   *)&memCtx.
                                      super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                                      .field_0x10,pvVar3);
                if (sVar4 == 3000) {
                  cookmem::MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                  deallocate((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *)
                             &memCtx.
                              super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                              .field_0x10,pvVar3,0);
                  for (local_2a8 = 30000; local_2a8 < 0x7544; local_2a8 = local_2a8 + 1) {
                    pvVar3 = cookmem::
                             MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                             allocate((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                       *)&memCtx.
                                          super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                                          .field_0x10,local_2a8);
                    if (pvVar3 == (void *)0x0) {
                      poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x86);
                      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                      memCtx.
                      super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.
                      m_pool._580_4_ = 1;
                      goto LAB_00105cf1;
                    }
                    memset(pvVar3,0xff,local_2a8);
                    sVar4 = cookmem::
                            MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                            getSize((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                     *)&memCtx.
                                        super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                                        .field_0x10,pvVar3);
                    if (local_2a8 != sVar4) {
                      poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x88);
                      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                      memCtx.
                      super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.
                      m_pool._580_4_ = 1;
                      goto LAB_00105cf1;
                    }
                    cookmem::MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                    deallocate((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *
                               )&memCtx.
                                 super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                                 .field_0x10,pvVar3,0);
                  }
                  memCtx.super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.
                  m_pool._580_4_ = 0;
                }
                else {
                  poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x80);
                  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                  memCtx.super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.
                  m_pool._580_4_ = 1;
                }
              }
            }
            else {
              poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
              poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x7b);
              std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
              memCtx.super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.m_pool
              ._580_4_ = 1;
            }
          }
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x75);
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          memCtx.super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.m_pool.
          _580_4_ = 1;
        }
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x6e);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      memCtx.super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.m_pool._580_4_
           = 1;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x6d);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    memCtx.super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.m_pool._580_4_ =
         1;
  }
LAB_00105cf1:
  cookmem::SimpleMemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
  ~SimpleMemContext((SimpleMemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *)
                    local_288);
  return memCtx.super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.m_pool.
         _580_4_;
}

Assistant:

static int
test3 ()
{
    cookmem::SimpleMemContext<cookmem::MallocArena> memCtx (true);

    ASSERT_EQ (true, memCtx.isPadding ());
    ASSERT_EQ (true, memCtx.isStoringExactSize ());

    void* ptr;

    ptr = memCtx.allocate (30);
    ASSERT_NE (nullptr, ptr);
    memset (ptr, 0xff, 30);
    ASSERT_EQ (30, memCtx.getSize (ptr));
    memCtx.deallocate (ptr);

    ptr = memCtx.allocate (300);
    ASSERT_NE (nullptr, ptr);
    memset (ptr, 0xff, 300);
    ASSERT_EQ (300, memCtx.getSize (ptr));

    ptr = memCtx.allocate (3000);
    ASSERT_NE (nullptr, ptr);
    memset (ptr, 0xff, 3000);
    ASSERT_EQ (3000, memCtx.getSize (ptr));
    memCtx.deallocate (ptr);

    for (size_t size = 30000; size < 30020; ++size)
    {
        ptr = memCtx.allocate (size);
        ASSERT_NE (nullptr, ptr);
        memset (ptr, 0xff, size);
        ASSERT_EQ (size, memCtx.getSize (ptr));
        memCtx.deallocate (ptr);
    }

    return 0;
}